

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs3deditor.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  EditorRenderer *this;
  
  this = (EditorRenderer *)operator_new(0x1f0);
  EditorRenderer::EditorRenderer(this);
  EditorRenderer::run(this);
  (*(this->super_Fl_Gl_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[1])
            (this);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	EditorRenderer* renderer = new EditorRenderer();

	renderer->run();

	delete renderer;
	return 0;
}